

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_address.c
# Opt level: O2

void cmime_address_set_name(CMimeAddress_T *ca,char *name)

{
  uint __line;
  char *pcVar1;
  
  if (ca == (CMimeAddress_T *)0x0) {
    pcVar1 = "ca";
    __line = 0x29;
  }
  else {
    if (name != (char *)0x0) {
      free(ca->name);
      pcVar1 = strdup(name);
      ca->name = pcVar1;
      return;
    }
    pcVar1 = "name";
    __line = 0x2a;
  }
  __assert_fail(pcVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_address.c"
                ,__line,"void cmime_address_set_name(CMimeAddress_T *, const char *)");
}

Assistant:

void cmime_address_set_name(CMimeAddress_T *ca, const char *name) {
    assert(ca);
    assert(name);
    
    if (ca->name != NULL)
        free(ca->name);
        
    ca->name = strdup(name);
}